

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::all2allv_big<char>
               (char *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               char *out,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
               comm *comm)

{
  value_type vVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  MPI_Datatype poVar10;
  MPI_Comm poVar11;
  MPI_Request *ppoVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__stat_loc;
  datatype local_100;
  undefined1 local_e8 [8];
  datatype dt_1;
  int send_to;
  int i_1;
  undefined1 local_b0 [8];
  datatype dt;
  int recv_from;
  int i;
  requests reqs;
  int tag;
  undefined1 local_60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  char *out_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_local;
  char *msgs_local;
  
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(send_sizes);
  iVar4 = mxx::comm::size(comm);
  if ((int)sVar7 != iVar4) {
    assert_fail("static_cast<int>(send_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                ,0x111,"all2allv_big");
  }
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(recv_sizes);
  iVar4 = mxx::comm::size(comm);
  if ((int)sVar7 != iVar4) {
    assert_fail("static_cast<int>(recv_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                ,0x112,"all2allv_big");
  }
  get_displacements<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,send_sizes);
  __stat_loc = recv_sizes;
  get_displacements<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,recv_sizes);
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3039;
  requests::requests((requests *)&recv_from);
  dt._20_4_ = 0;
  while( true ) {
    uVar2 = dt._20_4_;
    iVar4 = mxx::comm::size(comm);
    if (iVar4 <= (int)uVar2) break;
    iVar4 = mxx::comm::rank(comm);
    iVar5 = mxx::comm::size(comm);
    iVar5 = iVar5 - dt._20_4_;
    iVar6 = mxx::comm::size(comm);
    dt._16_4_ = (iVar4 + iVar5) % iVar6;
    get_datatype<char>();
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (recv_sizes,(long)(int)dt._16_4_);
    mxx::datatype::contiguous((datatype *)local_b0,(datatype *)&send_to,*pvVar8);
    mxx::datatype::~datatype((datatype *)&send_to);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                        (long)(int)dt._16_4_);
    vVar1 = *pvVar9;
    poVar10 = mxx::datatype::type((datatype *)local_b0);
    uVar3 = reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    uVar2 = dt._16_4_;
    poVar11 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
    ppoVar12 = requests::add((requests *)&recv_from);
    __stat_loc = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    MPI_Irecv(out + vVar1,1,poVar10,uVar2,uVar3,poVar11,ppoVar12);
    mxx::datatype::~datatype((datatype *)local_b0);
    dt._20_4_ = dt._20_4_ + 1;
  }
  dt_1._20_4_ = 0;
  while( true ) {
    uVar2 = dt_1._20_4_;
    iVar4 = mxx::comm::size(comm);
    if (iVar4 <= (int)uVar2) break;
    iVar4 = mxx::comm::rank(comm);
    iVar4 = iVar4 + dt_1._20_4_;
    iVar5 = mxx::comm::size(comm);
    dt_1._16_4_ = iVar4 % iVar5;
    get_datatype<char>();
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (send_sizes,(long)(int)dt_1._16_4_);
    mxx::datatype::contiguous((datatype *)local_e8,&local_100,*pvVar8);
    mxx::datatype::~datatype(&local_100);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &recv_displs.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(int)dt_1._16_4_);
    vVar1 = *pvVar9;
    poVar10 = mxx::datatype::type((datatype *)local_e8);
    uVar3 = reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    uVar2 = dt_1._16_4_;
    poVar11 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
    ppoVar12 = requests::add((requests *)&recv_from);
    __stat_loc = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    MPI_Isend(msgs + vVar1,1,poVar10,uVar2,uVar3,poVar11,ppoVar12);
    mxx::datatype::~datatype((datatype *)local_e8);
    dt_1._20_4_ = dt_1._20_4_ + 1;
  }
  requests::wait((requests *)&recv_from,__stat_loc);
  requests::~requests((requests *)&recv_from);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    std::vector<size_t> send_displs = get_displacements(send_sizes);
    std::vector<size_t> recv_displs = get_displacements(recv_sizes);
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}